

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O2

char * th06_find_format(uint version,uint id,_Bool is_timeline)

{
  char *pcVar1;
  seqmap_entry_t *psVar2;
  char *pcVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  id_format_pair_t *fmts;
  id_format_pair_t *fmts_00;
  
  uVar4 = (ulong)id;
  if ((int)CONCAT71(in_register_00000011,is_timeline) != 0) {
    pcVar1 = th06_find_timeline_format(version,id);
    return pcVar1;
  }
  psVar2 = seqmap_get(g_eclmap->ins_signatures,id);
  if (psVar2 != (seqmap_entry_t *)0x0) {
    return psVar2->value;
  }
  fmts_00 = th08_fmts;
  switch(version) {
  case 6:
    fmts_00 = th06_fmts;
    break;
  case 7:
    fmts_00 = th07_fmts;
    break;
  case 8:
    break;
  case 9:
    fmts = th09_fmts;
LAB_00116282:
    pcVar1 = find_format(fmts,id);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    break;
  default:
    if (version == 0x5f) {
      fmts = th95_fmts;
      goto LAB_00116282;
    }
    pcVar1 = "%s: unsupported version: %u\n";
    uVar4 = (ulong)version;
    goto LAB_001162f2;
  }
  pcVar3 = find_format(fmts_00,id);
  if (pcVar3 == (char *)0x0) {
    pcVar1 = "%s: id %d was not found in the format table\n";
LAB_001162f2:
    pcVar3 = (char *)0x0;
    fprintf(_stderr,pcVar1,argv0,uVar4);
  }
  return pcVar3;
}

Assistant:

static const char*
th06_find_format(
    unsigned int version,
    unsigned int id,
    bool is_timeline)
{
    if (is_timeline) return th06_find_timeline_format(version, id);

    seqmap_entry_t *ent = seqmap_get(g_eclmap->ins_signatures, id);
    if (ent)
        return ent->value;

    const char* ret = NULL;

    switch (version) {
    case 95:
        if ((ret = find_format(th95_fmts, id))) break;
        ret = find_format(th08_fmts, id);
        break;
    case 9:
        if ((ret = find_format(th09_fmts, id))) break; /* fallthrough */
    case 8:
        ret = find_format(th08_fmts, id);
        break;
    case 7:
        ret = find_format(th07_fmts, id);
        break;
    case 6:
        ret = find_format(th06_fmts, id);
        break;
    default:
        fprintf(stderr, "%s: unsupported version: %u\n", argv0, version);
        return NULL;
    }

    if (!ret)
        fprintf(stderr, "%s: id %d was not found in the format table\n", argv0, id);

    return ret;
}